

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_monitor.c
# Opt level: O3

RRCrtc glfwGetX11Adapter(GLFWmonitor *handle)

{
  char *format;
  int code;
  
  if (_glfw.initialized == 0) {
    code = 0x10001;
    format = (char *)0x0;
  }
  else {
    if (_glfw.platform.platformID == 0x60004) {
      return *(RRCrtc *)(handle + 0x128);
    }
    format = "X11: Platform not initialized";
    code = 0x1000e;
  }
  _glfwInputError(code,format);
  return 0;
}

Assistant:

GLFWAPI RRCrtc glfwGetX11Adapter(GLFWmonitor* handle)
{
    _GLFWmonitor* monitor = (_GLFWmonitor*) handle;
    _GLFW_REQUIRE_INIT_OR_RETURN(None);

    if (_glfw.platform.platformID != GLFW_PLATFORM_X11)
    {
        _glfwInputError(GLFW_PLATFORM_UNAVAILABLE, "X11: Platform not initialized");
        return None;
    }

    return monitor->x11.crtc;
}